

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

string * Potassco::xconvert(string *out,unsigned_long n)

{
  long in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff78;
  StringBuilder *in_stack_ffffffffffffff80;
  StringBuilder *in_stack_ffffffffffffff90;
  undefined8 local_8;
  
  if (in_RSI == -1) {
    local_8 = (string *)std::__cxx11::string::append((char *)in_RDI);
  }
  else {
    StringBuilder::StringBuilder(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    StringBuilder::append(in_stack_ffffffffffffff80,(unsigned_long)in_stack_ffffffffffffff78);
    StringBuilder::~StringBuilder(in_stack_ffffffffffffff90);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

string& xconvert(string& out, unsigned long n) {
	return n != static_cast<unsigned long>(-1) ? (StringBuilder(out).append(n), out) : out.append("umax");
}